

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int util_scan_files(char *dir,char ***result)

{
  dirent *pdVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  char *__s;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  char **filelist;
  dirent **files;
  char **subdirs;
  size_t capacity;
  stat stat_buf;
  char **local_110;
  ulong local_108;
  dirent **local_100;
  long local_f8;
  char **local_f0;
  size_t local_e8;
  ulong local_e0;
  char *local_d8;
  char ***local_d0;
  char *local_c8;
  stat local_c0;
  
  iVar3 = stat(dir,&local_c0);
  if (iVar3 == -1) {
    return -1;
  }
  if ((local_c0.st_mode & 0xf000) != 0x4000) {
    return -1;
  }
  uVar4 = scandir(dir,&local_100,util_scan_files_comp,alphasort);
  if (-1 < (int)uVar4) {
    local_110 = (char **)0x0;
    local_e8 = 0;
    iVar3 = util_vec_ensure(&local_110,&local_e8,8,8);
    if (iVar3 != 0) {
      return -1;
    }
    if (uVar4 == 0) {
      lVar9 = 0;
    }
    else {
      uVar10 = (ulong)uVar4;
      uVar11 = 0;
      lVar8 = 0;
      local_e0 = uVar10;
      local_d8 = dir;
      local_d0 = result;
      do {
        pdVar1 = local_100[uVar11];
        __s = pdVar1->d_name;
        local_108 = uVar11;
        sVar5 = strlen(dir);
        sVar6 = strlen(__s);
        pcVar7 = (char *)malloc(sVar5 + sVar6 + 3);
        strcpy(pcVar7,dir);
        sVar5 = strlen(dir);
        if (dir[sVar5 - 1] != '/') {
          sVar5 = strlen(pcVar7);
          (pcVar7 + sVar5)[0] = '/';
          (pcVar7 + sVar5)[1] = '\0';
        }
        strcat(pcVar7,__s);
        iVar3 = stat(pcVar7,&local_c0);
        uVar11 = local_108;
        if (iVar3 == -1) {
          free(local_100[local_108]);
          lVar9 = lVar8;
LAB_00103a11:
          free(pcVar7);
          uVar4 = 4;
        }
        else if ((local_c0.st_mode & 0xf000) == 0x4000) {
          sVar5 = strlen(__s);
          if (pdVar1->d_name[sVar5 - 1] != '/') {
            sVar5 = strlen(pcVar7);
            (pcVar7 + sVar5)[0] = '/';
            (pcVar7 + sVar5)[1] = '\0';
          }
          uVar4 = util_scan_files(pcVar7,&local_f0);
          ppcVar2 = local_f0;
          bVar12 = 0 < (int)uVar4;
          local_c8 = pcVar7;
          if ((int)uVar4 < 1) {
            uVar4 = 5;
          }
          else {
            uVar11 = 1;
            local_f8 = lVar8;
            do {
              uVar10 = uVar11;
              sVar5 = strlen(ppcVar2[uVar10 - 1]);
              pcVar7 = (char *)malloc(sVar5 + 1);
              local_110[lVar8 + (uVar10 - 1)] = pcVar7;
              strcpy(pcVar7,ppcVar2[uVar10 - 1]);
              free(ppcVar2[uVar10 - 1]);
              iVar3 = util_vec_ensure(&local_110,&local_e8,local_f8 + uVar10 + 1,8);
              if (iVar3 != 0) {
                uVar4 = 8;
                goto LAB_001039cf;
              }
              bVar12 = uVar10 < uVar4;
              uVar11 = uVar10 + 1;
            } while (uVar10 != uVar4);
            uVar4 = 5;
LAB_001039cf:
            lVar8 = local_f8 + uVar10;
            dir = local_d8;
            uVar10 = local_e0;
            result = local_d0;
          }
          uVar11 = local_108;
          lVar9 = lVar8;
          if (!bVar12) {
            free(local_f0);
            free(local_100[uVar11]);
            pcVar7 = local_c8;
            goto LAB_00103a11;
          }
        }
        else {
          lVar9 = lVar8 + 1;
          local_110[lVar8] = pcVar7;
          iVar3 = util_vec_ensure(&local_110,&local_e8,lVar8 + 2,8);
          uVar11 = local_108;
          uVar4 = 8;
          if (iVar3 == 0) {
            free(local_100[local_108]);
            uVar4 = 0;
          }
        }
        if ((uVar4 & 0xb) != 0) goto LAB_00103a43;
        uVar11 = uVar11 + 1;
        lVar8 = lVar9;
      } while (uVar11 != uVar10);
    }
    uVar4 = 2;
LAB_00103a43:
    ppcVar2 = local_110;
    if (uVar4 != 8) {
      if (uVar4 != 2) {
        return -1;
      }
      *result = local_110;
      return (int)lVar9;
    }
    if (local_110 == (char **)0x0) {
      return -1;
    }
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      free(ppcVar2[lVar9 + -1]);
    }
    free(ppcVar2);
  }
  return -1;
}

Assistant:

int
util_scan_files(
    const char* dir,
    char*** result)
{
    struct stat stat_buf;
    if (stat(dir, &stat_buf) == -1)
        return -1;
    // We can only scan directories
    if (!S_ISDIR(stat_buf.st_mode))
        return -1;

    struct dirent **files;
    int n;
    n = scandir(dir, &files, util_scan_files_comp, alphasort);
    if (n < 0)
        return -1;

    char** filelist = NULL;
    size_t size = 0, capacity = 0;
    if (util_vec_ensure(&filelist, &capacity, 8, sizeof(char*)))
        return -1;
    for (int i = 0; i < n; ++i) {
        const char* name = files[i]->d_name;
        char* fullpath = malloc(strlen(dir)+strlen(name)+3);
        strcpy(fullpath, dir);
        if (dir[strlen(dir)-1] != '/') strcat(fullpath, "/");
        strcat(fullpath, name);
        if (stat(fullpath, &stat_buf) == -1) {
            free(files[i]);
            free(fullpath);
            continue;
        }
        if (S_ISDIR(stat_buf.st_mode)) {
            char** subdirs;
            if (name[strlen(name)-1] != '/') strcat(fullpath, "/");
            int new_cnt = util_scan_files(fullpath, &subdirs);
            for (int j = 0; j < new_cnt; j++) {
                filelist[size] = malloc(strlen(subdirs[j])+1);
                strcpy(filelist[size++], subdirs[j]);
                free(subdirs[j]);

                if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
                    goto err;
            }
            free(subdirs);
            free(files[i]);
            free(fullpath);
            continue;
        }
        filelist[size++] = fullpath;
        if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
            goto err;
        free(files[i]);
    }
    *result = filelist;
    return size;
err:
    if (filelist) {
        while (size--)
            free(filelist[size]);
        free(filelist);
    }
    return -1;
}